

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O2

iu_uint_max_t iutest::internal::posix::FileSize(FILE *fp)

{
  int iVar1;
  StatStruct st;
  StatStruct SStack_98;
  
  if (fp == (FILE *)0x0) {
    return 0;
  }
  iVar1 = Stat(fp,&SStack_98);
  if (iVar1 != 0) {
    SStack_98.st_size = FileSizeBySeekSet(fp);
  }
  return SStack_98.st_size;
}

Assistant:

inline iu_uint_max_t FileSize(FILE* fp)
{
    if( fp == NULL )
    {
        return 0;
    }
#if IUTEST_HAS_FILE_STAT
    StatStruct st;
    if (Stat(fp, &st) == 0)
    {
        return static_cast<iu_uint_max_t>(st.st_size);
    }
#endif
    return FileSizeBySeekSet(fp);
}